

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

optional<unsigned_int> __thiscall
slang::parsing::Preprocessor::requireUInt32(Preprocessor *this,PragmaExpressionSyntax *expr)

{
  SyntaxKind SVar1;
  double value;
  SimplePragmaExpressionSyntax *pSVar2;
  _Optional_payload_base<unsigned_int> _Var3;
  ulong uVar4;
  SourceRange range;
  Token token;
  Token local_30;
  anon_class_16_2_3fdfa3b0 checkResult;
  
  SVar1 = (expr->super_SyntaxNode).kind;
  checkResult.this = this;
  checkResult.expr = expr;
  if (SVar1 == NumberPragmaExpression) {
    slang::syntax::SyntaxNode::as<slang::syntax::NumberPragmaExpressionSyntax>
              (&expr->super_SyntaxNode);
    Token::intValue(&token);
    _Var3 = (_Optional_payload_base<unsigned_int>)
            requireUInt32::anon_class_16_2_3fdfa3b0::operator()(&checkResult,(SVInt *)&token);
    uVar4 = (ulong)_Var3 & 0xffffff0000000000;
    SVInt::~SVInt((SVInt *)&token);
    goto LAB_00185b15;
  }
  if (SVar1 == SimplePragmaExpression) {
    pSVar2 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>
                       (&expr->super_SyntaxNode);
    token.kind = (pSVar2->value).kind;
    token._2_1_ = (pSVar2->value).field_0x2;
    token.numFlags.raw = (pSVar2->value).numFlags.raw;
    token.rawLen = (pSVar2->value).rawLen;
    token.info = (pSVar2->value).info;
    if (token.kind == RealLiteral) {
      value = Token::realValue(&token);
      SVInt::fromDouble((SVInt *)&local_30,0x20,value,true);
      _Var3 = (_Optional_payload_base<unsigned_int>)
              requireUInt32::anon_class_16_2_3fdfa3b0::operator()(&checkResult,(SVInt *)&local_30);
    }
    else {
      if (token.kind != IntegerLiteral) goto LAB_00185a70;
      Token::intValue(&local_30);
      _Var3 = (_Optional_payload_base<unsigned_int>)
              requireUInt32::anon_class_16_2_3fdfa3b0::operator()(&checkResult,(SVInt *)&local_30);
    }
    SVInt::~SVInt((SVInt *)&local_30);
    uVar4 = (ulong)_Var3 & 0xffffff0000000000;
  }
  else {
LAB_00185a70:
    range = slang::syntax::SyntaxNode::sourceRange(&expr->super_SyntaxNode);
    addDiag(this,(DiagCode)0x240004,range);
    uVar4 = 0;
    _Var3._M_payload = (_Storage<unsigned_int,_true>)0x0;
    _Var3._M_engaged = false;
    _Var3._5_3_ = 0;
  }
LAB_00185b15:
  return (optional<unsigned_int>)((ulong)_Var3 & 0xffffffffff | uVar4);
}

Assistant:

std::optional<uint32_t> Preprocessor::requireUInt32(const PragmaExpressionSyntax& expr) {
    auto checkResult = [&](const SVInt& svi) -> std::optional<uint32_t> {
        auto value = svi.as<int32_t>();
        if (!value || *value < 0) {
            addDiag(diag::InvalidPragmaNumber, expr.sourceRange());
            return {};
        }

        return uint32_t(*value);
    };

    if (expr.kind == SyntaxKind::SimplePragmaExpression) {
        auto token = expr.as<SimplePragmaExpressionSyntax>().value;
        if (token.kind == TokenKind::IntegerLiteral)
            return checkResult(token.intValue());
        else if (token.kind == TokenKind::RealLiteral)
            return checkResult(SVInt::fromDouble(32, token.realValue(), true));
    }
    else if (expr.kind == SyntaxKind::NumberPragmaExpression) {
        return checkResult(expr.as<NumberPragmaExpressionSyntax>().value.intValue());
    }

    addDiag(diag::InvalidPragmaNumber, expr.sourceRange());
    return {};
}